

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O2

void __thiscall duckdb::LimitSourceState::~LimitSourceState(LimitSourceState *this)

{
  ~LimitSourceState(this);
  operator_delete(this);
  return;
}

Assistant:

LimitSourceState() {
		initialized = false;
		current_offset = 0;
	}